

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O2

void __thiscall trun::ResultsReportJSON::PrintSummary(ResultsReportJSON *this)

{
  ResultSummary *pRVar1;
  
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Summary\":{");
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  pRVar1 = ResultSummary::Instance();
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"DurationSec\":%f,",pRVar1->durationSec);
  pRVar1 = ResultSummary::Instance();
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"TestsExecuted\":%d,",
             (ulong)(uint)pRVar1->testsExecuted);
  pRVar1 = ResultSummary::Instance();
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"TestsFailed\":%d",
             (ulong)(uint)pRVar1->testsFailed);
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::Write(&this->super_ResultsReportPinterBase,"}");
  this->bHadSummary = true;
  return;
}

Assistant:

void ResultsReportJSON::PrintSummary() {

    WriteLine("\"Summary\":{");
    PushIndent();
    WriteLine("\"DurationSec\":%f,", ResultSummary::Instance().durationSec);
    WriteLine("\"TestsExecuted\":%d,", ResultSummary::Instance().testsExecuted);
    WriteLine("\"TestsFailed\":%d", ResultSummary::Instance().testsFailed);
    PopIndent();
    Write("}");
    bHadSummary = true;
}